

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int GetMaxLabelLength(void *hPtr)

{
  int32_t iVar1;
  int iVar2;
  int lid;
  shared_ptr<const_fasttext::Dictionary> dict;
  string label;
  
  fasttext::FastText::getDictionary((FastText *)&dict);
  iVar1 = fasttext::Dictionary::nlabels
                    (dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (lid = 0; iVar1 != lid; lid = lid + 1) {
    fasttext::Dictionary::getLabel_abi_cxx11_
              (&label,dict.
                      super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,lid);
    if ((ulong)(long)iVar2 < label._M_string_length) {
      iVar2 = (int)label._M_string_length;
    }
    std::__cxx11::string::~string((string *)&label);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar2;
}

Assistant:

GetMaxLabelLength(void* hPtr)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    int maxLen = 0;

    try {
        for (int i = 0; i < numLabels; ++i)
        {
            auto label = dict->getLabel(i);
            if (label.length() > maxLen)
            {
                maxLen = label.length();
            }
        }

        return maxLen;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}